

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

void glad_debug_impl_glClearColor(GLfloat arg0,GLfloat arg1,GLfloat arg2,GLfloat arg3)

{
  (*_pre_call_callback)("glClearColor",glad_debug_glClearColor,4);
  (*glad_glClearColor)(arg0,arg1,arg2,arg3);
  (*_post_call_callback)
            ("glClearColor",glad_debug_glClearColor,4,(double)arg0,(double)arg1,(double)arg2,
             (double)arg3,_post_call_callback);
  return;
}

Assistant:

void APIENTRY glad_debug_impl_glClearColor(GLfloat arg0, GLfloat arg1, GLfloat arg2, GLfloat arg3) {    
    _pre_call_callback("glClearColor", (void*)glClearColor, 4, arg0, arg1, arg2, arg3);
     glad_glClearColor(arg0, arg1, arg2, arg3);
    _post_call_callback("glClearColor", (void*)glClearColor, 4, arg0, arg1, arg2, arg3);
    
}